

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

bool __thiscall ON_NurbsSurface::IsSingular(ON_NurbsSurface *this,int side)

{
  bool bVar1;
  int local_28;
  int local_24;
  int point_stride;
  int point_count;
  double *points;
  bool rc;
  int side_local;
  ON_NurbsSurface *this_local;
  
  _point_stride = (double *)0x0;
  local_24 = 0;
  local_28 = 0;
  switch(side) {
  case 0:
    bVar1 = IsClamped(this,1,0);
    points._3_1_ = (bool)(-bVar1 & 1);
    if (points._3_1_ != false) {
      _point_stride = CV(this,0,0);
      local_24 = this->m_cv_count[0];
      local_28 = this->m_cv_stride[0];
    }
    break;
  case 1:
    bVar1 = IsClamped(this,0,1);
    points._3_1_ = (bool)(-bVar1 & 1);
    if (points._3_1_ != false) {
      _point_stride = CV(this,this->m_cv_count[0] + -1,0);
      local_24 = this->m_cv_count[1];
      local_28 = this->m_cv_stride[1];
    }
    break;
  case 2:
    bVar1 = IsClamped(this,1,1);
    points._3_1_ = (bool)(-bVar1 & 1);
    if (points._3_1_ != false) {
      _point_stride = CV(this,0,this->m_cv_count[1] + -1);
      local_24 = this->m_cv_count[0];
      local_28 = this->m_cv_stride[0];
    }
    break;
  case 3:
    bVar1 = IsClamped(this,0,0);
    points._3_1_ = (bool)(-bVar1 & 1);
    if (points._3_1_ != false) {
      _point_stride = CV(this,0,0);
      local_24 = this->m_cv_count[1];
      local_28 = this->m_cv_stride[1];
    }
    break;
  default:
    points._3_1_ = false;
  }
  if (points._3_1_ != false) {
    points._3_1_ = ON_PointsAreCoincident
                             (this->m_dim,this->m_is_rat != 0,local_24,local_28,_point_stride);
  }
  return points._3_1_;
}

Assistant:

bool
ON_NurbsSurface::IsSingular( // true if surface side is collapsed to a point
      int side   // side of parameter space to test
                 // 0 = south, 1 = east, 2 = north, 3 = west
      ) const
{
  bool rc = false;
  const double* points = 0;
  int point_count = 0;
  int point_stride = 0;

  switch ( side ) 
  {
  case 0: // south
    rc = IsClamped(1,0)?true:false;
    if ( rc )
    {
      points = CV(0,0);
      point_count = m_cv_count[0];
      point_stride = m_cv_stride[0];
    }
    break;

  case 1: // east
    rc = IsClamped(0,1)?true:false;
    if (rc)
    {
      points = CV(m_cv_count[0]-1,0);
      point_count = m_cv_count[1];
      point_stride = m_cv_stride[1];
    }
    break;

  case 2: // north
    rc  = IsClamped(1,1)?true:false;
    if (rc)
    {
      points = CV(0,m_cv_count[1]-1);
      point_count = m_cv_count[0];
      point_stride = m_cv_stride[0];
    }
    break;

  case 3: // west
    rc = IsClamped( 0, 0 )?true:false;
    if (rc) 
    {
      points = CV(0,0);
      point_count = m_cv_count[1];
      point_stride = m_cv_stride[1];
    }
    break;

  default:
    rc = false;
    break;
  }

  if (rc)
    rc = ON_PointsAreCoincident(m_dim,m_is_rat,point_count,point_stride,points);

  return rc;
}